

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,OPJ_UINT32 win_x0,OPJ_UINT32 win_y0,OPJ_UINT32 win_x1,
                            OPJ_UINT32 win_y1,OPJ_UINT32 numcomps_to_decode,
                            OPJ_UINT32 *comps_indices,OPJ_BYTE *p_src,OPJ_UINT32 p_max_length,
                            OPJ_UINT32 p_tile_no,opj_codestream_index_t *p_cstr_index,
                            opj_event_mgr_t *p_manager)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  opj_tcd_resolution_t *poVar4;
  opj_image_comp_t *poVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  OPJ_BOOL OVar8;
  int *piVar9;
  opj_t2_t *p_t2;
  opj_mutex_t *p_manager_mutex;
  opj_image_t *poVar10;
  long lVar11;
  void *pvVar12;
  OPJ_BYTE **pData;
  OPJ_INT32 **ppOVar13;
  opj_tcd_resolution_t *poVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  char *fmt;
  OPJ_INT32 *c2;
  OPJ_FLOAT32 *c2_00;
  uint uVar20;
  OPJ_UINT32 *pOVar21;
  float *pfVar22;
  int *piVar23;
  int iVar24;
  float fVar25;
  OPJ_INT32 *c1;
  OPJ_FLOAT32 *c1_00;
  float fVar26;
  OPJ_INT32 *c0;
  OPJ_FLOAT32 *c0_00;
  ulong uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  opj_tcd_tilecomp_t *poVar32;
  opj_tcp_t *poVar33;
  opj_tccp_t *poVar34;
  float fVar35;
  long lVar36;
  opj_tcd_tile_t *poVar37;
  ulong uVar38;
  int iVar39;
  float fVar40;
  OPJ_UINT32 *pOVar41;
  opj_image_t *local_88;
  OPJ_BOOL local_74;
  ulong local_70;
  ulong local_68;
  opj_tcd_tilecomp_t *local_60;
  OPJ_UINT32 l_data_read;
  opj_tcd_tilecomp_t *local_50;
  opj_image_comp_t *local_48;
  opj_tcd_tile_t *local_40;
  ulong local_38;
  
  p_tcd->tcd_tileno = p_tile_no;
  p_tcd->tcp = p_tcd->cp->tcps + p_tile_no;
  p_tcd->win_x0 = win_x0;
  p_tcd->win_y0 = win_y0;
  p_tcd->win_x1 = win_x1;
  p_tcd->win_y1 = win_y1;
  p_tcd->whole_tile_decoding = 1;
  opj_free(p_tcd->used_component);
  p_tcd->used_component = (OPJ_BOOL *)0x0;
  if (numcomps_to_decode == 0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)opj_calloc(4,(ulong)p_tcd->image->numcomps);
    if (piVar9 == (int *)0x0) {
      return 0;
    }
    uVar19 = 0;
    do {
      piVar9[comps_indices[uVar19]] = 1;
      uVar19 = uVar19 + 1;
    } while (numcomps_to_decode != uVar19);
    p_tcd->used_component = piVar9;
  }
  local_88 = p_tcd->image;
  uVar19 = (ulong)local_88->numcomps;
  if (uVar19 != 0) {
    lVar31 = 4;
    lVar36 = 0;
    piVar23 = piVar9;
    do {
      local_70 = uVar19;
      if ((piVar9 == (int *)0x0) || (*piVar23 != 0)) {
        uVar27 = (ulong)*(uint *)((long)local_88->comps + lVar31 + -4);
        if (uVar27 == 0) goto LAB_001395f2;
        uVar29 = (ulong)*(uint *)((long)&local_88->comps->dx + lVar31);
        if (uVar29 == 0) goto LAB_001395f2;
        poVar32 = p_tcd->tcd_image->tiles->comps;
        uVar16 = *(int *)((long)&poVar32->numresolutions + lVar36) -
                 *(int *)((long)&poVar32->minimum_num_resolutions + lVar36);
        if (uVar16 < 0x20) {
          puVar1 = (uint *)((long)&poVar32->x0 + lVar36);
          uVar18 = (uint)(((p_tcd->win_x0 + uVar27) - 1) / uVar27);
          uVar28 = 0;
          if (*puVar1 <= uVar18) {
            uVar28 = uVar18 - *puVar1;
          }
          bVar15 = (byte)uVar16;
          if (uVar28 >> (bVar15 & 0x1f) == 0) {
            puVar1 = (uint *)((long)&poVar32->y0 + lVar36);
            uVar28 = (uint)(((p_tcd->win_y0 + uVar29) - 1) / uVar29);
            uVar16 = 0;
            if (*puVar1 <= uVar28) {
              uVar16 = uVar28 - *puVar1;
            }
            if (uVar16 >> (bVar15 & 0x1f) == 0) {
              uVar16 = *(uint *)((long)&poVar32->x1 + lVar36);
              uVar18 = (uint)(((ulong)p_tcd->win_x1 + (uVar27 - 1)) / uVar27);
              uVar28 = 0;
              if (uVar18 <= uVar16) {
                uVar28 = uVar16 - uVar18;
              }
              if (uVar28 >> (bVar15 & 0x1f) == 0) {
                uVar16 = *(uint *)((long)&poVar32->y1 + lVar36);
                uVar18 = (uint)(((p_tcd->win_y1 + uVar29) - 1) / uVar29);
                uVar28 = 0;
                if (uVar18 <= uVar16) {
                  uVar28 = uVar16 - uVar18;
                }
                if (uVar28 >> (bVar15 & 0x1f) == 0) goto LAB_00138ac0;
              }
            }
          }
          p_tcd->whole_tile_decoding = 0;
          goto LAB_00138bb5;
        }
      }
LAB_00138ac0:
      piVar23 = piVar23 + 1;
      lVar36 = lVar36 + 0x70;
      lVar31 = lVar31 + 0x40;
    } while (uVar19 * 0x70 - lVar36 != 0);
    if (p_tcd->whole_tile_decoding == 0) {
LAB_00138bb5:
      if (uVar19 != 0) {
        local_60 = p_tcd->tcd_image->tiles->comps;
        poVar5 = local_88->comps;
        uVar27 = 0;
        do {
          if ((piVar9 == (int *)0x0) || (piVar9[uVar27] != 0)) {
            uVar29 = (ulong)poVar5[uVar27].dx;
            if (uVar29 == 0) {
LAB_001395f2:
              __assert_fail("b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/opj_intmath.h"
                            ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
            }
            poVar32 = local_60 + uVar27;
            uVar16 = (uint)(((p_tcd->win_x0 + uVar29) - 1) / uVar29);
            if (uVar16 < (uint)poVar32->x0) {
              uVar16 = poVar32->x0;
            }
            poVar32->win_x0 = uVar16;
            uVar38 = (ulong)poVar5[uVar27].dy;
            if (uVar38 == 0) goto LAB_001395f2;
            uVar28 = (uint)(((p_tcd->win_y0 + uVar38) - 1) / uVar38);
            if (uVar28 < (uint)poVar32->y0) {
              uVar28 = poVar32->y0;
            }
            poVar32->win_y0 = uVar28;
            uVar18 = (uint)(((ulong)p_tcd->win_x1 + (uVar29 - 1)) / uVar29);
            if ((uint)poVar32->x1 < uVar18) {
              uVar18 = poVar32->x1;
            }
            poVar32->win_x1 = uVar18;
            uVar20 = (uint)(((p_tcd->win_y1 + uVar38) - 1) / uVar38);
            if ((uint)poVar32->y1 < uVar20) {
              uVar20 = poVar32->y1;
            }
            poVar32->win_y1 = uVar20;
            if ((uVar18 < uVar16) || (uVar20 < uVar28)) {
              fmt = "Invalid tilec->win_xxx values\n";
              goto LAB_0013915d;
            }
            uVar17 = poVar32->numresolutions;
            uVar29 = (ulong)uVar17;
            if (uVar29 != 0) {
              poVar4 = poVar32->resolutions;
              lVar31 = 0;
              do {
                uVar17 = uVar17 - 1;
                bVar15 = (byte)uVar17;
                uVar38 = ~(-1L << (bVar15 & 0x3f));
                *(int *)((long)&poVar4->win_x0 + lVar31) = (int)(uVar38 + uVar16 >> (bVar15 & 0x3f))
                ;
                *(int *)((long)&poVar4->win_y0 + lVar31) = (int)(uVar38 + uVar28 >> (bVar15 & 0x3f))
                ;
                *(int *)((long)&poVar4->win_x1 + lVar31) = (int)(uVar38 + uVar18 >> (bVar15 & 0x3f))
                ;
                *(int *)((long)&poVar4->win_y1 + lVar31) = (int)(uVar38 + uVar20 >> (bVar15 & 0x3f))
                ;
                lVar31 = lVar31 + 0xc0;
              } while (uVar29 * 0xc0 != lVar31);
            }
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar19);
      }
    }
    else if (uVar19 != 0) {
      lVar31 = 0;
      uVar19 = 0;
      do {
        poVar32 = p_tcd->tcd_image->tiles->comps;
        lVar36 = *(long *)((long)&poVar32->resolutions + lVar31);
        lVar30 = (ulong)(*(int *)((long)&poVar32->minimum_num_resolutions + lVar31) - 1) * 0xc0;
        if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar19] != 0)) {
          uVar27 = (long)*(int *)(lVar36 + 8 + lVar30) - (long)*(int *)(lVar36 + lVar30);
          iVar24 = *(int *)(lVar36 + 0xc + lVar30) - *(int *)(lVar36 + 4 + lVar30);
          if (((iVar24 != 0) &&
              (auVar6._8_8_ = 0, auVar6._0_8_ = (long)iVar24, auVar7._8_8_ = 0,
              auVar7._0_8_ = uVar27, SUB168(auVar6 * auVar7,8) != 0)) ||
             (uVar27 = (long)iVar24 * uVar27, 0x3fffffffffffffff < uVar27)) goto LAB_00139156;
          *(ulong *)((long)&poVar32->data_size_needed + lVar31) = uVar27 * 4;
          OVar8 = opj_alloc_tile_component_data((opj_tcd_tilecomp_t *)((long)&poVar32->x0 + lVar31))
          ;
          if (OVar8 == 0) goto LAB_00139156;
          local_88 = p_tcd->image;
        }
        uVar19 = uVar19 + 1;
        lVar31 = lVar31 + 0x70;
      } while (uVar19 < local_88->numcomps);
    }
  }
  l_data_read = 0;
  p_t2 = opj_t2_create(local_88,p_tcd->cp);
  if (p_t2 == (opj_t2_t *)0x0) {
    return 0;
  }
  OVar8 = opj_t2_decode_packets
                    (p_tcd,p_t2,p_tcd->tcd_tileno,p_tcd->tcd_image->tiles,p_src,&l_data_read,
                     p_max_length,p_cstr_index,p_manager);
  opj_t2_destroy(p_t2);
  if (OVar8 == 0) {
    return 0;
  }
  poVar37 = p_tcd->tcd_image->tiles;
  poVar32 = poVar37->comps;
  poVar34 = p_tcd->tcp->tccps;
  local_74 = 1;
  p_manager_mutex = opj_mutex_create();
  uVar16 = 0;
  if (p_tcd->tcp->num_layers_to_decode == p_tcd->tcp->numlayers) {
    uVar16 = poVar34->cblksty >> 4 & 1;
  }
  uVar28 = poVar37->numcomps;
  if (uVar28 != 0) {
    uVar19 = 0;
    do {
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar19] != 0)) {
        opj_t1_decode_cblks(p_tcd,&local_74,poVar32,poVar34,p_manager,p_manager_mutex,uVar16);
        if (local_74 == 0) break;
        uVar28 = poVar37->numcomps;
      }
      uVar19 = uVar19 + 1;
      poVar32 = poVar32 + 1;
      poVar34 = poVar34 + 1;
    } while (uVar19 < uVar28);
  }
  opj_thread_pool_wait_completion(p_tcd->thread_pool,0);
  if (p_manager_mutex != (opj_mutex_t *)0x0) {
    opj_mutex_destroy(p_manager_mutex);
  }
  if (local_74 == 0) {
    return 0;
  }
  if ((p_tcd->whole_tile_decoding == 0) && (poVar10 = p_tcd->image, poVar10->numcomps != 0)) {
    lVar31 = 0x14;
    lVar36 = 9;
    uVar19 = 0;
    do {
      poVar32 = p_tcd->tcd_image->tiles->comps;
      lVar11 = (ulong)(&poVar10->comps->dx)[lVar36] * 0xc0;
      lVar30 = *(long *)((long)poVar32 + lVar31 * 4 + -0x30);
      iVar24 = *(int *)(lVar30 + 0xb8 + lVar11);
      iVar39 = *(int *)(lVar30 + 0xb0 + lVar11);
      iVar2 = *(int *)(lVar30 + 0xb4 + lVar11);
      iVar3 = *(int *)(lVar30 + 0xbc + lVar11);
      opj_image_data_free(*(void **)(&poVar32->x0 + lVar31));
      *(undefined8 *)(&poVar32->x0 + lVar31) = 0;
      if (((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar19] != 0)) &&
         (iVar3 != iVar2 && iVar24 != iVar39)) {
        uVar27 = (ulong)(uint)(iVar3 - iVar2) * (ulong)(uint)(iVar24 - iVar39);
        if (0x3fffffffffffffff < uVar27) goto LAB_00139156;
        pvVar12 = opj_image_data_alloc(uVar27 * 4);
        *(void **)(&poVar32->x0 + lVar31) = pvVar12;
        if (pvVar12 == (void *)0x0) goto LAB_00139156;
      }
      uVar19 = uVar19 + 1;
      poVar10 = p_tcd->image;
      lVar31 = lVar31 + 0x1c;
      lVar36 = lVar36 + 0x10;
    } while (uVar19 < poVar10->numcomps);
  }
  poVar33 = p_tcd->tcp;
  poVar37 = p_tcd->tcd_image->tiles;
  if (poVar37->numcomps != 0) {
    poVar32 = poVar37->comps;
    pOVar21 = &p_tcd->image->comps->resno_decoded;
    pOVar41 = &poVar33->tccps->qmfbid;
    uVar19 = 0;
    do {
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar19] != 0)) {
        if (*pOVar41 == 1) {
          iVar24 = opj_dwt_decode(p_tcd,poVar32,*pOVar21 + 1);
        }
        else {
          iVar24 = opj_dwt_decode_real(p_tcd,poVar32,*pOVar21 + 1);
        }
        if (iVar24 == 0) {
          return 0;
        }
      }
      uVar19 = uVar19 + 1;
      poVar32 = poVar32 + 1;
      pOVar21 = pOVar21 + 0x10;
      pOVar41 = pOVar41 + 0x10e;
    } while (uVar19 < poVar37->numcomps);
    poVar33 = p_tcd->tcp;
    poVar37 = p_tcd->tcd_image->tiles;
  }
  if ((poVar33->mct == 0) || (p_tcd->used_component != (OPJ_BOOL *)0x0)) goto LAB_00139300;
  poVar32 = poVar37->comps;
  iVar24 = p_tcd->whole_tile_decoding;
  poVar4 = poVar32->resolutions;
  if (iVar24 == 0) {
    uVar16 = poVar37->numcomps;
    if (uVar16 < 3) goto LAB_001392e5;
    poVar5 = p_tcd->image->comps;
    uVar28 = poVar5->resno_decoded;
    uVar18 = poVar5[2].resno_decoded;
    if (uVar28 == uVar18 && poVar5[1].resno_decoded == uVar28) {
      poVar14 = poVar32[1].resolutions;
      uVar20 = (poVar4[uVar28].win_y1 - poVar4[uVar28].win_y0) *
               (poVar4[uVar28].win_x1 - poVar4[uVar28].win_x0);
      lVar31 = (ulong)(poVar14[uVar28].win_y1 - poVar14[uVar28].win_y0) *
               (ulong)(poVar14[uVar28].win_x1 - poVar14[uVar28].win_x0);
      if (lVar31 - (ulong)uVar20 == 0) {
        poVar4 = poVar32[2].resolutions;
        lVar31 = (ulong)(poVar4[uVar18].win_y1 - poVar4[uVar18].win_y0) *
                 (ulong)(poVar4[uVar18].win_x1 - poVar4[uVar18].win_x0) - lVar31;
joined_r0x00139245:
        if (lVar31 == 0) {
          uVar19 = (ulong)uVar20;
          if (poVar33->mct == 2) {
            if (poVar33->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
              pData = (OPJ_BYTE **)opj_malloc((ulong)uVar16 << 3);
              if (pData == (OPJ_BYTE **)0x0) {
                return 0;
              }
              uVar16 = poVar37->numcomps;
              if ((ulong)uVar16 != 0) {
                ppOVar13 = &poVar32->data + (ulong)(p_tcd->whole_tile_decoding == 0) * 4;
                uVar27 = 0;
                do {
                  pData[uVar27] = (OPJ_BYTE *)*ppOVar13;
                  uVar27 = uVar27 + 1;
                  ppOVar13 = ppOVar13 + 0xe;
                } while (uVar16 != uVar27);
              }
              OVar8 = opj_mct_decode_custom
                                ((OPJ_BYTE *)poVar33->m_mct_decoding_matrix,uVar19,pData,uVar16,
                                 p_tcd->image->comps->sgnd);
              opj_free(pData);
              if (OVar8 == 0) {
                return 0;
              }
            }
          }
          else if (poVar33->tccps->qmfbid == 1) {
            if (iVar24 == 0) {
              c0 = poVar32->data_win;
              c1 = poVar32[1].data_win;
              c2 = poVar32[2].data_win;
            }
            else {
              c0 = poVar32->data;
              c1 = poVar32[1].data;
              c2 = poVar32[2].data;
            }
            opj_mct_decode(c0,c1,c2,uVar19);
          }
          else {
            if (iVar24 == 0) {
              c0_00 = (OPJ_FLOAT32 *)poVar32->data_win;
              c1_00 = (OPJ_FLOAT32 *)poVar32[1].data_win;
              c2_00 = (OPJ_FLOAT32 *)poVar32[2].data_win;
            }
            else {
              c0_00 = (OPJ_FLOAT32 *)poVar32->data;
              c1_00 = (OPJ_FLOAT32 *)poVar32[1].data;
              c2_00 = (OPJ_FLOAT32 *)poVar32[2].data;
            }
            opj_mct_decode_real(c0_00,c1_00,c2_00,uVar19);
          }
          goto LAB_00139300;
        }
      }
    }
  }
  else {
    uVar16 = poVar37->numcomps;
    if (uVar16 < 3) {
LAB_001392e5:
      opj_event_msg(p_manager,1,
                    "Number of components (%d) is inconsistent with a MCT. Skip the MCT step.\n");
LAB_00139300:
      local_40 = p_tcd->tcd_image->tiles;
      if (local_40->numcomps != 0) {
        local_48 = p_tcd->image->comps;
        poVar34 = p_tcd->tcp->tccps;
        local_50 = local_40->comps;
        local_68 = 0;
        do {
          if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[local_68] != 0))
          {
            poVar4 = local_50->resolutions;
            poVar14 = poVar4 + local_48->resno_decoded;
            if (p_tcd->whole_tile_decoding == 0) {
              iVar24 = poVar14->win_x1 - poVar14->win_x0;
              uVar28 = poVar14->win_y1 - poVar14->win_y0;
              pfVar22 = (float *)local_50->data_win;
              uVar16 = 0;
            }
            else {
              iVar24 = poVar14->x1 - poVar14->x0;
              uVar16 = local_50->minimum_num_resolutions - 1;
              uVar18 = poVar4[uVar16].x1 - poVar4[uVar16].x0;
              uVar16 = uVar18 - iVar24;
              pfVar22 = (float *)local_50->data;
              uVar28 = poVar14->y1 - poVar14->y0;
              if (uVar28 == 0) {
                uVar28 = 0;
              }
              else if (local_50->data_size / (ulong)uVar28 < (ulong)uVar18) {
                __assert_fail("l_height == 0 || l_width + l_stride <= l_tile_comp->data_size / l_height"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/tcd.c"
                              ,0x89f,"OPJ_BOOL opj_tcd_dc_level_shift_decode(opj_tcd_t *)");
              }
            }
            bVar15 = (byte)local_48->prec;
            if (local_48->sgnd == 0) {
              fVar40 = (float)~(-1 << (bVar15 & 0x1f));
              fVar35 = 0.0;
            }
            else {
              iVar39 = 1 << (bVar15 - 1 & 0x1f);
              fVar35 = (float)-iVar39;
              fVar40 = (float)(iVar39 + -1);
            }
            if (poVar34->qmfbid == 1) {
              if (uVar28 != 0) {
                uVar18 = 0;
                iVar39 = iVar24;
                do {
                  for (; iVar39 != 0; iVar39 = iVar39 + -1) {
                    fVar25 = (float)(poVar34->m_dc_level_shift + (int)*pfVar22);
                    fVar26 = fVar40;
                    if ((int)fVar25 < (int)fVar40) {
                      fVar26 = fVar25;
                    }
                    if ((int)fVar25 < (int)fVar35) {
                      fVar26 = fVar35;
                    }
                    *pfVar22 = fVar26;
                    pfVar22 = pfVar22 + 1;
                  }
                  pfVar22 = pfVar22 + uVar16;
                  uVar18 = uVar18 + 1;
                  iVar39 = iVar24;
                } while (uVar18 != uVar28);
              }
            }
            else if (uVar28 != 0) {
              local_38 = (ulong)uVar16;
              uVar16 = 0;
              local_70 = CONCAT44(local_70._4_4_,iVar24);
              do {
                local_60 = (opj_tcd_tilecomp_t *)CONCAT44(local_60._4_4_,uVar16);
                for (; iVar24 != 0; iVar24 = iVar24 + -1) {
                  fVar26 = *pfVar22;
                  fVar25 = fVar40;
                  if ((fVar26 <= 2.1474836e+09) && (fVar25 = fVar35, -2.1474836e+09 <= fVar26)) {
                    lVar36 = lrintf(fVar26);
                    lVar36 = poVar34->m_dc_level_shift + lVar36;
                    lVar31 = lVar36;
                    if ((int)fVar40 <= lVar36) {
                      lVar31 = (long)(int)fVar40;
                    }
                    fVar25 = (float)lVar31;
                    if (lVar36 < (int)fVar35) {
                      fVar25 = fVar35;
                    }
                  }
                  *pfVar22 = fVar25;
                  pfVar22 = pfVar22 + 1;
                }
                pfVar22 = pfVar22 + local_38;
                uVar16 = (int)local_60 + 1;
                iVar24 = (int)local_70;
              } while (uVar16 != uVar28);
            }
          }
          local_68 = local_68 + 1;
          local_48 = local_48 + 1;
          poVar34 = poVar34 + 1;
          local_50 = local_50 + 1;
        } while (local_68 < local_40->numcomps);
      }
      return 1;
    }
    uVar28 = poVar32->minimum_num_resolutions;
    if ((uVar28 == poVar32[1].minimum_num_resolutions) &&
       (uVar28 == poVar32[2].minimum_num_resolutions)) {
      poVar5 = p_tcd->image->comps;
      if ((poVar5->resno_decoded == poVar5[1].resno_decoded) &&
         (poVar5->resno_decoded == poVar5[2].resno_decoded)) {
        uVar20 = (poVar4[(ulong)uVar28 - 1].y1 - poVar4[(ulong)uVar28 - 1].y0) *
                 (poVar4[(ulong)uVar28 - 1].x1 - poVar4[(ulong)uVar28 - 1].x0);
        poVar4 = poVar32[1].resolutions;
        lVar31 = ((long)poVar4[(ulong)uVar28 - 1].y1 - (long)poVar4[(ulong)uVar28 - 1].y0) *
                 ((long)poVar4[(ulong)uVar28 - 1].x1 - (long)poVar4[(ulong)uVar28 - 1].x0);
        if (lVar31 - (ulong)uVar20 == 0) {
          poVar4 = poVar32[2].resolutions;
          lVar31 = ((long)poVar4[(ulong)uVar28 - 1].y1 - (long)poVar4[(ulong)uVar28 - 1].y0) *
                   ((long)poVar4[(ulong)uVar28 - 1].x1 - (long)poVar4[(ulong)uVar28 - 1].x0) -
                   lVar31;
          goto joined_r0x00139245;
        }
      }
    }
  }
  fmt = "Tiles don\'t all have the same dimension. Skip the MCT step.\n";
LAB_0013915d:
  opj_event_msg(p_manager,1,fmt);
  return 0;
LAB_00139156:
  fmt = "Size of tile data exceeds system limits\n";
  goto LAB_0013915d;
}

Assistant:

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,
                             OPJ_UINT32 win_x0,
                             OPJ_UINT32 win_y0,
                             OPJ_UINT32 win_x1,
                             OPJ_UINT32 win_y1,
                             OPJ_UINT32 numcomps_to_decode,
                             const OPJ_UINT32 *comps_indices,
                             OPJ_BYTE *p_src,
                             OPJ_UINT32 p_max_length,
                             OPJ_UINT32 p_tile_no,
                             opj_codestream_index_t *p_cstr_index,
                             opj_event_mgr_t *p_manager
                            )
{
    OPJ_UINT32 l_data_read;
    OPJ_UINT32 compno;

    p_tcd->tcd_tileno = p_tile_no;
    p_tcd->tcp = &(p_tcd->cp->tcps[p_tile_no]);
    p_tcd->win_x0 = win_x0;
    p_tcd->win_y0 = win_y0;
    p_tcd->win_x1 = win_x1;
    p_tcd->win_y1 = win_y1;
    p_tcd->whole_tile_decoding = OPJ_TRUE;

    opj_free(p_tcd->used_component);
    p_tcd->used_component = NULL;

    if (numcomps_to_decode) {
        OPJ_BOOL* used_component = (OPJ_BOOL*) opj_calloc(sizeof(OPJ_BOOL),
                                   p_tcd->image->numcomps);
        if (used_component == NULL) {
            return OPJ_FALSE;
        }
        for (compno = 0; compno < numcomps_to_decode; compno++) {
            used_component[ comps_indices[compno] ] = OPJ_TRUE;
        }

        p_tcd->used_component = used_component;
    }

    for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
        if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
            continue;
        }

        if (!opj_tcd_is_whole_tilecomp_decoding(p_tcd, compno)) {
            p_tcd->whole_tile_decoding = OPJ_FALSE;
            break;
        }
    }

    if (p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_tcd_resolution_t *l_res = &
                                          (tilec->resolutions[tilec->minimum_num_resolutions - 1]);
            OPJ_SIZE_T l_data_size;

            /* compute l_data_size with overflow check */
            OPJ_SIZE_T res_w = (OPJ_SIZE_T)(l_res->x1 - l_res->x0);
            OPJ_SIZE_T res_h = (OPJ_SIZE_T)(l_res->y1 - l_res->y0);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* issue 733, l_data_size == 0U, probably something wrong should be checked before getting here */
            if (res_h > 0 && res_w > SIZE_MAX / res_h) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size = res_w * res_h;

            if (SIZE_MAX / sizeof(OPJ_UINT32) < l_data_size) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size *= sizeof(OPJ_UINT32);

            tilec->data_size_needed = l_data_size;

            if (!opj_alloc_tile_component_data(tilec)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
        }
    } else {
        /* Compute restricted tile-component and tile-resolution coordinates */
        /* of the window of interest, but defer the memory allocation until */
        /* we know the resno_decoded */
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            OPJ_UINT32 resno;
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* Compute the intersection of the area of interest, expressed in tile coordinates */
            /* with the tile coordinates */
            tilec->win_x0 = opj_uint_max(
                                (OPJ_UINT32)tilec->x0,
                                opj_uint_ceildiv(p_tcd->win_x0, image_comp->dx));
            tilec->win_y0 = opj_uint_max(
                                (OPJ_UINT32)tilec->y0,
                                opj_uint_ceildiv(p_tcd->win_y0, image_comp->dy));
            tilec->win_x1 = opj_uint_min(
                                (OPJ_UINT32)tilec->x1,
                                opj_uint_ceildiv(p_tcd->win_x1, image_comp->dx));
            tilec->win_y1 = opj_uint_min(
                                (OPJ_UINT32)tilec->y1,
                                opj_uint_ceildiv(p_tcd->win_y1, image_comp->dy));
            if (tilec->win_x1 < tilec->win_x0 ||
                    tilec->win_y1 < tilec->win_y0) {
                /* We should not normally go there. The circumstance is when */
                /* the tile coordinates do not intersect the area of interest */
                /* Upper level logic should not even try to decode that tile */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid tilec->win_xxx values\n");
                return OPJ_FALSE;
            }

            for (resno = 0; resno < tilec->numresolutions; ++resno) {
                opj_tcd_resolution_t *res = tilec->resolutions + resno;
                res->win_x0 = opj_uint_ceildivpow2(tilec->win_x0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y0 = opj_uint_ceildivpow2(tilec->win_y0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_x1 = opj_uint_ceildivpow2(tilec->win_x1,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y1 = opj_uint_ceildivpow2(tilec->win_y1,
                                                   tilec->numresolutions - 1 - resno);
            }
        }
    }

#ifdef TODO_MSD /* FIXME */
    /* INDEX >>  */
    if (p_cstr_info) {
        OPJ_UINT32 resno, compno, numprec = 0;
        for (compno = 0; compno < (OPJ_UINT32) p_cstr_info->numcomps; compno++) {
            opj_tcp_t *tcp = &p_tcd->cp->tcps[0];
            opj_tccp_t *tccp = &tcp->tccps[compno];
            opj_tcd_tilecomp_t *tilec_idx = &p_tcd->tcd_image->tiles->comps[compno];
            for (resno = 0; resno < tilec_idx->numresolutions; resno++) {
                opj_tcd_resolution_t *res_idx = &tilec_idx->resolutions[resno];
                p_cstr_info->tile[p_tile_no].pw[resno] = res_idx->pw;
                p_cstr_info->tile[p_tile_no].ph[resno] = res_idx->ph;
                numprec += res_idx->pw * res_idx->ph;
                p_cstr_info->tile[p_tile_no].pdx[resno] = tccp->prcw[resno];
                p_cstr_info->tile[p_tile_no].pdy[resno] = tccp->prch[resno];
            }
        }
        p_cstr_info->tile[p_tile_no].packet = (opj_packet_info_t *) opj_malloc(
                p_cstr_info->numlayers * numprec * sizeof(opj_packet_info_t));
        p_cstr_info->packno = 0;
    }
    /* << INDEX */
#endif

    /*--------------TIER2------------------*/
    /* FIXME _ProfStart(PGROUP_T2); */
    l_data_read = 0;
    if (! opj_tcd_t2_decode(p_tcd, p_src, &l_data_read, p_max_length, p_cstr_index,
                            p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T2); */

    /*------------------TIER1-----------------*/

    /* FIXME _ProfStart(PGROUP_T1); */
    if (! opj_tcd_t1_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T1); */


    /* For subtile decoding, now we know the resno_decoded, we can allocate */
    /* the tile data buffer */
    if (!p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);
            opj_tcd_resolution_t *res = tilec->resolutions + image_comp->resno_decoded;
            OPJ_SIZE_T w = res->win_x1 - res->win_x0;
            OPJ_SIZE_T h = res->win_y1 - res->win_y0;
            OPJ_SIZE_T l_data_size;

            opj_image_data_free(tilec->data_win);
            tilec->data_win = NULL;

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            if (w > 0 && h > 0) {
                if (w > SIZE_MAX / h) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size = w * h;
                if (l_data_size > SIZE_MAX / sizeof(OPJ_INT32)) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size *= sizeof(OPJ_INT32);

                tilec->data_win = (OPJ_INT32*) opj_image_data_alloc(l_data_size);
                if (tilec->data_win == NULL) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
            }
        }
    }

    /*----------------DWT---------------------*/

    /* FIXME _ProfStart(PGROUP_DWT); */
    if
    (! opj_tcd_dwt_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DWT); */

    /*----------------MCT-------------------*/
    /* FIXME _ProfStart(PGROUP_MCT); */
    if
    (! opj_tcd_mct_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_MCT); */

    /* FIXME _ProfStart(PGROUP_DC_SHIFT); */
    if
    (! opj_tcd_dc_level_shift_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DC_SHIFT); */


    /*---------------TILE-------------------*/
    return OPJ_TRUE;
}